

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O1

errno_t strcpy_s<256ul>(char (*_Dst) [256],char *_Src)

{
  char cVar1;
  long lVar2;
  long lVar3;
  errno_t eVar4;
  
  if (_Src == (char *)0x0) {
    (*_Dst)[0] = '\0';
    memset(*_Dst + 1,0xfd,0xff);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    eVar4 = 0x16;
  }
  else {
    lVar3 = 0x100;
    lVar2 = 0;
    do {
      cVar1 = _Src[lVar2];
      (*_Dst)[lVar2] = cVar1;
      if (cVar1 == '\0') goto LAB_00b259f6;
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    lVar3 = 0;
LAB_00b259f6:
    if (lVar3 == 0) {
      (*_Dst)[0] = '\0';
      memset(*_Dst + 1,0xfd,0xff);
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
      eVar4 = 0x22;
    }
    else {
      eVar4 = 0;
      if (0x101U - lVar3 < 0x100) {
        memset((void *)((long)_Dst + (0x101U - lVar3)),0xfd,lVar3 - 1);
        eVar4 = 0;
      }
    }
  }
  return eVar4;
}

Assistant:

inline
errno_t __cdecl strcpy_s(char (&_Dst)[_SizeInBytes], const char *_Src)
{
    return strcpy_s(_Dst, _SizeInBytes, _Src);
}